

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_map_set(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int iVar1;
  list_head *plVar2;
  JSValueUnion ctx_00;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  JSMapState *pJVar6;
  JSMapRecord *pJVar7;
  list_head *plVar8;
  ulong uVar9;
  list_head *plVar10;
  uint uVar11;
  int64_t extraout_RDX;
  list_head *extraout_RDX_00;
  list_head *plVar12;
  ulong uVar13;
  int *piVar14;
  list_head *plVar15;
  JSValueUnion JVar16;
  JSValue key;
  JSValue key_00;
  JSValue JVar17;
  JSValue JVar18;
  size_t slack;
  JSValueUnion local_70;
  ulong local_68;
  JSValueUnion local_60;
  JSMapState *local_58;
  int64_t local_50;
  ulong local_48;
  int64_t local_40;
  JSValueUnion local_38;
  
  pJVar6 = (JSMapState *)JS_GetOpaque2(ctx,this_val,magic + 0x1f);
  if (pJVar6 != (JSMapState *)0x0) {
    JVar16 = (JSValueUnion)argv->tag;
    ctx_00.ptr = (argv->u).ptr;
    if (((ulong)(argv->u).ptr & 0x7fffffffffffffff) == 0 && (argv->tag & 0xffffffffU) == 7) {
      JVar16.float64 = 0.0;
      ctx_00.float64 = 0.0;
    }
    local_60 = this_val.u;
    local_40 = this_val.tag;
    if ((pJVar6->is_weak == 0) || (JVar16.int32 == 0xffffffff)) {
      if ((magic & 1U) == 0) {
        local_50 = argv[1].tag;
        local_48 = (ulong)argv[1].u.ptr & 0xffffffff;
        local_68 = (ulong)argv[1].u.ptr & 0xffffffff00000000;
      }
      else {
        local_50 = 3;
        local_48 = 0;
        local_68 = 0;
      }
      JVar18.tag = (int64_t)JVar16.ptr;
      JVar18.u.ptr = ctx_00.ptr;
      pJVar7 = map_find_record(ctx,pJVar6,JVar18);
      if (pJVar7 == (JSMapRecord *)0x0) {
        local_58 = pJVar6;
        local_38 = ctx_00;
        pJVar7 = (JSMapRecord *)js_malloc(ctx,0x58);
        if (pJVar7 == (JSMapRecord *)0x0) {
          pJVar7 = (JSMapRecord *)0x0;
        }
        else {
          pJVar7->ref_count = 1;
          pJVar7->empty = 0;
          pJVar7->map = local_58;
          if (local_58->is_weak == 0) {
            local_70 = ctx_00;
            if (0xfffffff4 < (uint)JVar16.int32) {
              *(int *)ctx_00.ptr = *ctx_00.ptr + 1;
            }
          }
          else {
            pJVar7->next_weak_ref = *(JSMapRecord **)((long)local_38.ptr + 0x28);
            *(JSMapRecord **)((long)local_38.ptr + 0x28) = pJVar7;
          }
          (pJVar7->key).u.ptr = (void *)ctx_00;
          (pJVar7->key).tag = (int64_t)JVar16;
          key.tag = extraout_RDX;
          key.u.float64 = JVar16.float64;
          uVar3 = map_hash_key((JSContext *)ctx_00.ptr,key);
          uVar4 = local_58->hash_size;
          uVar11 = uVar4 - 1 & uVar3;
          plVar8 = local_58->hash_table;
          plVar10 = plVar8[uVar11].prev;
          plVar10->next = &pJVar7->hash_link;
          (pJVar7->hash_link).prev = plVar10;
          (pJVar7->hash_link).next = plVar8 + uVar11;
          plVar8[uVar11].prev = &pJVar7->hash_link;
          plVar15 = &pJVar6->records;
          plVar10 = (local_58->records).prev;
          plVar10->next = &pJVar7->link;
          (pJVar7->link).prev = plVar10;
          (pJVar7->link).next = plVar15;
          (local_58->records).prev = &pJVar7->link;
          uVar11 = local_58->record_count + 1;
          local_58->record_count = uVar11;
          if (local_58->record_count_threshold <= uVar11) {
            uVar9 = 4;
            if (uVar4 != 1) {
              uVar9 = (ulong)(uVar4 * 2);
            }
            plVar8 = (list_head *)js_realloc2(ctx,plVar8,uVar9 << 4,(size_t *)&local_70.int32);
            if (plVar8 != (list_head *)0x0) {
              uVar11 = (int)uVar9 + (int)((ulong)local_70.ptr >> 4);
              if (uVar11 != 0) {
                uVar9 = (ulong)uVar11;
                plVar10 = plVar8;
                do {
                  plVar10->prev = plVar10;
                  plVar10->next = plVar10;
                  plVar10 = plVar10 + 1;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
              }
              plVar10 = (local_58->records).next;
              pJVar6 = local_58;
              if (plVar10 != plVar15) {
                plVar12 = extraout_RDX_00;
                do {
                  if (*(int *)((long)&plVar10[-2].next + 4) == 0) {
                    key_00.tag = (int64_t)plVar12;
                    key_00.u = (JSValueUnion)(JSValueUnion)plVar10[2].next;
                    uVar4 = map_hash_key((JSContext *)plVar10[2].prev,key_00);
                    uVar5 = uVar4 & uVar11 - 1;
                    plVar12 = plVar8 + uVar5;
                    plVar2 = plVar8[uVar5].prev;
                    plVar2->next = plVar10 + 1;
                    plVar10[1].prev = plVar2;
                    plVar10[1].next = plVar12;
                    plVar8[uVar5].prev = plVar10 + 1;
                    pJVar6 = local_58;
                  }
                  plVar10 = plVar10->next;
                } while (plVar10 != plVar15);
              }
              pJVar6->hash_table = plVar8;
              pJVar6->hash_size = uVar11;
              pJVar6->record_count_threshold = uVar11 * 2;
            }
          }
        }
        if (pJVar7 == (JSMapRecord *)0x0) goto LAB_00147dc2;
      }
      else {
        local_70 = (JSValueUnion)(pJVar7->value).u.ptr;
        JVar18 = pJVar7->value;
        if ((0xfffffff4 < (uint)(pJVar7->value).tag) &&
           (iVar1 = *local_70.ptr, *(int *)local_70.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar18);
        }
      }
      piVar14 = (int *)(local_68 | local_48);
      if (0xfffffff4 < (uint)local_50) {
        *piVar14 = *piVar14 + 1;
      }
      (pJVar7->value).u.ptr = piVar14;
      (pJVar7->value).tag = local_50;
      if (0xfffffff4 < (uint)local_40) {
        *(int *)local_60.ptr = *local_60.ptr + 1;
      }
      uVar9 = (ulong)local_60.ptr & 0xffffffff00000000;
      uVar13 = (ulong)local_60.ptr & 0xffffffff;
      goto LAB_00147dc9;
    }
    JS_ThrowTypeError(ctx,"not an object");
  }
LAB_00147dc2:
  uVar13 = 0;
  uVar9 = 0;
  local_40 = 6;
LAB_00147dc9:
  JVar17.tag = local_40;
  JVar17.u.ptr = (void *)(uVar13 | uVar9);
  return JVar17;
}

Assistant:

static JSValue js_map_set(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSMapRecord *mr;
    JSValueConst key, value;

    if (!s)
        return JS_EXCEPTION;
    key = map_normalize_key(ctx, argv[0]);
    if (s->is_weak && !JS_IsObject(key))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    if (magic & MAGIC_SET)
        value = JS_UNDEFINED;
    else
        value = argv[1];
    mr = map_find_record(ctx, s, key);
    if (mr) {
        JS_FreeValue(ctx, mr->value);
    } else {
        mr = map_add_record(ctx, s, key);
        if (!mr)
            return JS_EXCEPTION;
    }
    mr->value = JS_DupValue(ctx, value);
    return JS_DupValue(ctx, this_val);
}